

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderPauseTimer(CHud *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ITextRender *pIVar6;
  char *format;
  IClient *this_00;
  CHud *in_RDI;
  long in_FS_OFFSET;
  float f;
  float Seconds;
  int64 CursorVersion;
  char *pText;
  char aBuf [256];
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  CTextCursor *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  CTextCursor *in_stack_fffffffffffffeb0;
  char local_108 [80];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((((in_RDI->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateFlags & 0x30U) ==
      0x10) {
    pcVar5 = Localize((char *)in_stack_fffffffffffffeb0,
                      (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if ((RenderPauseTimer()::s_GamePausedCursor == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderPauseTimer()::s_GamePausedCursor), iVar2 != 0)) {
      CTextCursor::CTextCursor(in_stack_fffffffffffffeb0);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderPauseTimer::s_GamePausedCursor,&__dso_handle);
      __cxa_guard_release(&RenderPauseTimer()::s_GamePausedCursor);
    }
    CComponent::Graphics((CComponent *)0x1635f5);
    IGraphics::ScreenAspect((IGraphics *)in_stack_fffffffffffffea0);
    CTextCursor::MoveTo(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                        in_stack_fffffffffffffe98);
    RenderPauseTimer::s_GamePausedCursor.m_Align = 1;
    RenderPauseTimer::s_GamePausedCursor.m_FontSize = 20.0;
    CLocalizationDatabase::Version(&g_Localization);
    CTextCursor::Reset(in_stack_fffffffffffffea0,
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    pIVar6 = CComponent::TextRender((CComponent *)0x16365f);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0xb])
              (pIVar6,&RenderPauseTimer::s_GamePausedCursor,pcVar5,0xffffffff);
    if ((RenderPauseTimer()::s_Cursor == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderPauseTimer()::s_Cursor), iVar2 != 0)) {
      CTextCursor::CTextCursor(in_stack_fffffffffffffeb0);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderPauseTimer::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderPauseTimer()::s_Cursor);
    }
    CComponent::Graphics((CComponent *)0x1636d1);
    IGraphics::ScreenAspect((IGraphics *)in_stack_fffffffffffffea0);
    CTextCursor::MoveTo(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                        in_stack_fffffffffffffe98);
    RenderPauseTimer::s_Cursor.m_Align = 1;
    RenderPauseTimer::s_Cursor.m_FontSize = 16.0;
    if (((((in_RDI->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateEndTick == 0) {
      CLocalizationDatabase::Version(&g_Localization);
      if ((((in_RDI->super_CComponent).m_pClient)->m_Snap).m_NotReadyCount == 1) {
        pcVar5 = Localize((char *)in_stack_fffffffffffffeb0,
                          (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        str_format(local_108,0x100,pcVar5,
                   (ulong)(uint)(((in_RDI->super_CComponent).m_pClient)->m_Snap).m_NotReadyCount);
      }
      else {
        if ((((in_RDI->super_CComponent).m_pClient)->m_Snap).m_NotReadyCount < 2) goto LAB_0016394a;
        pcVar5 = local_108;
        format = Localize(pcVar5,(char *)CONCAT44(in_stack_fffffffffffffeac,
                                                  in_stack_fffffffffffffea8));
        str_format(pcVar5,0x100,format,
                   (ulong)(uint)(((in_RDI->super_CComponent).m_pClient)->m_Snap).m_NotReadyCount);
      }
      RenderReadyUpNotification(in_RDI);
      CTextCursor::Reset(in_stack_fffffffffffffea0,
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    else {
      iVar2 = ((((in_RDI->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateEndTick;
      this_00 = CComponent::Client((CComponent *)0x16388b);
      iVar3 = IClient::GameTick(this_00);
      f = (float)(iVar2 - iVar3) / 50.0;
      if (5.0 <= f) {
        in_stack_fffffffffffffea0 = (CTextCursor *)local_108;
        uVar4 = round_to_int(f);
        str_format((char *)in_stack_fffffffffffffea0,0x100,"%d",(ulong)uVar4);
      }
      else {
        str_format((char *)(double)f,(int)local_108,(char *)0x100,"%.1f");
      }
      CTextCursor::Reset(in_stack_fffffffffffffea0,
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    pIVar6 = CComponent::TextRender((CComponent *)0x163930);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0xb])
              (pIVar6,&RenderPauseTimer::s_Cursor,local_108,0xffffffff);
  }
LAB_0016394a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderPauseTimer()
{
	if((m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_STARTCOUNTDOWN|GAMESTATEFLAG_PAUSED)) == GAMESTATEFLAG_PAUSED)
	{
		char aBuf[256];
		const char *pText = Localize("Game paused");
		static CTextCursor s_GamePausedCursor;
		s_GamePausedCursor.MoveTo(150 * Graphics()->ScreenAspect(), 50);
		s_GamePausedCursor.m_Align = TEXTALIGN_TC;
		s_GamePausedCursor.m_FontSize = 20.0f;
		s_GamePausedCursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_GamePausedCursor, pText, -1);

		static CTextCursor s_Cursor;
		s_Cursor.MoveTo(150 * Graphics()->ScreenAspect(), 75);
		s_Cursor.m_Align = TEXTALIGN_TC;
		s_Cursor.m_FontSize = 16.0f;

		if(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0)
		{
			const int64 CursorVersion = g_Localization.Version() << 8 | m_pClient->m_Snap.m_NotReadyCount;

			if(m_pClient->m_Snap.m_NotReadyCount == 1)
				str_format(aBuf, sizeof(aBuf), Localize("%d player not ready"), m_pClient->m_Snap.m_NotReadyCount);
			else if(m_pClient->m_Snap.m_NotReadyCount > 1)
				str_format(aBuf, sizeof(aBuf), Localize("%d players not ready"), m_pClient->m_Snap.m_NotReadyCount);
			else
				return;
			RenderReadyUpNotification();
			s_Cursor.Reset(CursorVersion);
		}
		else
		{
			float Seconds = static_cast<float>(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick-Client()->GameTick())/SERVER_TICK_SPEED;
			if(Seconds < 5)
				str_format(aBuf, sizeof(aBuf), "%.1f", Seconds);
			else
				str_format(aBuf, sizeof(aBuf), "%d", round_to_int(Seconds));
			s_Cursor.Reset();
		}

		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}